

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat_test.cc
# Opt level: O3

void leveldb::_Test_InternalKeyShortSeparator::_RunIt(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 auStack_2b0 [32];
  string sStack_290;
  string sStack_270;
  leveldb *plStack_250;
  string *psStack_248;
  leveldb alStack_240 [16];
  leveldb *plStack_230;
  string *psStack_228;
  leveldb alStack_220 [16];
  leveldb *plStack_210;
  string *psStack_208;
  leveldb alStack_200 [16];
  string sStack_1f0;
  Tester TStack_1d0;
  
  TStack_1d0.ok_ = true;
  TStack_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat_test.cc"
  ;
  TStack_1d0.line_ = 0x4d;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1d0.ss_);
  plStack_210 = alStack_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_210,"foo","");
  IKey(&sStack_270,plStack_210,psStack_208,100,kTypeValue);
  plStack_230 = alStack_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_230,"foo","");
  IKey((string *)auStack_2b0,plStack_230,psStack_228,100,kTypeValue);
  plStack_250 = alStack_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_250,"foo","");
  IKey(&sStack_290,plStack_250,psStack_248,99,kTypeValue);
  Shorten(&sStack_1f0,(leveldb *)auStack_2b0._0_8_,(string *)auStack_2b0._8_8_,&sStack_290);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&TStack_1d0,&sStack_270,&sStack_1f0)
  ;
  paVar1 = &sStack_1f0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_1f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_290._M_dataplus._M_p != &sStack_290.field_2) {
    operator_delete(sStack_290._M_dataplus._M_p);
  }
  if (plStack_250 != alStack_240) {
    operator_delete(plStack_250);
  }
  if ((leveldb *)auStack_2b0._0_8_ != (leveldb *)(auStack_2b0 + 0x10)) {
    operator_delete((void *)auStack_2b0._0_8_);
  }
  if (plStack_230 != alStack_220) {
    operator_delete(plStack_230);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_270._M_dataplus._M_p != &sStack_270.field_2) {
    operator_delete(sStack_270._M_dataplus._M_p);
  }
  if (plStack_210 != alStack_200) {
    operator_delete(plStack_210);
  }
  test::Tester::~Tester(&TStack_1d0);
  TStack_1d0.ok_ = true;
  TStack_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat_test.cc"
  ;
  TStack_1d0.line_ = 0x50;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1d0.ss_);
  plStack_210 = alStack_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_210,"foo","");
  IKey(&sStack_270,plStack_210,psStack_208,100,kTypeValue);
  plStack_230 = alStack_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_230,"foo","");
  IKey((string *)auStack_2b0,plStack_230,psStack_228,100,kTypeValue);
  plStack_250 = alStack_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_250,"foo","");
  IKey(&sStack_290,plStack_250,psStack_248,0x65,kTypeValue);
  Shorten(&sStack_1f0,(leveldb *)auStack_2b0._0_8_,(string *)auStack_2b0._8_8_,&sStack_290);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&TStack_1d0,&sStack_270,&sStack_1f0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_1f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_290._M_dataplus._M_p != &sStack_290.field_2) {
    operator_delete(sStack_290._M_dataplus._M_p);
  }
  if (plStack_250 != alStack_240) {
    operator_delete(plStack_250);
  }
  if ((leveldb *)auStack_2b0._0_8_ != (leveldb *)(auStack_2b0 + 0x10)) {
    operator_delete((void *)auStack_2b0._0_8_);
  }
  if (plStack_230 != alStack_220) {
    operator_delete(plStack_230);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_270._M_dataplus._M_p != &sStack_270.field_2) {
    operator_delete(sStack_270._M_dataplus._M_p);
  }
  if (plStack_210 != alStack_200) {
    operator_delete(plStack_210);
  }
  test::Tester::~Tester(&TStack_1d0);
  TStack_1d0.ok_ = true;
  TStack_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat_test.cc"
  ;
  TStack_1d0.line_ = 0x53;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1d0.ss_);
  plStack_210 = alStack_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_210,"foo","");
  IKey(&sStack_270,plStack_210,psStack_208,100,kTypeValue);
  plStack_230 = alStack_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_230,"foo","");
  IKey((string *)auStack_2b0,plStack_230,psStack_228,100,kTypeValue);
  plStack_250 = alStack_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_250,"foo","");
  IKey(&sStack_290,plStack_250,psStack_248,100,kTypeValue);
  Shorten(&sStack_1f0,(leveldb *)auStack_2b0._0_8_,(string *)auStack_2b0._8_8_,&sStack_290);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&TStack_1d0,&sStack_270,&sStack_1f0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_1f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_290._M_dataplus._M_p != &sStack_290.field_2) {
    operator_delete(sStack_290._M_dataplus._M_p);
  }
  if (plStack_250 != alStack_240) {
    operator_delete(plStack_250);
  }
  if ((leveldb *)auStack_2b0._0_8_ != (leveldb *)(auStack_2b0 + 0x10)) {
    operator_delete((void *)auStack_2b0._0_8_);
  }
  if (plStack_230 != alStack_220) {
    operator_delete(plStack_230);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_270._M_dataplus._M_p != &sStack_270.field_2) {
    operator_delete(sStack_270._M_dataplus._M_p);
  }
  if (plStack_210 != alStack_200) {
    operator_delete(plStack_210);
  }
  test::Tester::~Tester(&TStack_1d0);
  TStack_1d0.ok_ = true;
  TStack_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat_test.cc"
  ;
  TStack_1d0.line_ = 0x56;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1d0.ss_);
  plStack_210 = alStack_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_210,"foo","");
  IKey(&sStack_270,plStack_210,psStack_208,100,kTypeValue);
  plStack_230 = alStack_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_230,"foo","");
  IKey((string *)auStack_2b0,plStack_230,psStack_228,100,kTypeValue);
  plStack_250 = alStack_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_250,"foo","");
  IKey(&sStack_290,plStack_250,psStack_248,100,kTypeDeletion);
  Shorten(&sStack_1f0,(leveldb *)auStack_2b0._0_8_,(string *)auStack_2b0._8_8_,&sStack_290);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&TStack_1d0,&sStack_270,&sStack_1f0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_1f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_290._M_dataplus._M_p != &sStack_290.field_2) {
    operator_delete(sStack_290._M_dataplus._M_p);
  }
  if (plStack_250 != alStack_240) {
    operator_delete(plStack_250);
  }
  if ((leveldb *)auStack_2b0._0_8_ != (leveldb *)(auStack_2b0 + 0x10)) {
    operator_delete((void *)auStack_2b0._0_8_);
  }
  if (plStack_230 != alStack_220) {
    operator_delete(plStack_230);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_270._M_dataplus._M_p != &sStack_270.field_2) {
    operator_delete(sStack_270._M_dataplus._M_p);
  }
  if (plStack_210 != alStack_200) {
    operator_delete(plStack_210);
  }
  test::Tester::~Tester(&TStack_1d0);
  TStack_1d0.ok_ = true;
  TStack_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat_test.cc"
  ;
  TStack_1d0.line_ = 0x5a;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1d0.ss_);
  plStack_210 = alStack_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_210,"foo","");
  IKey(&sStack_270,plStack_210,psStack_208,100,kTypeValue);
  plStack_230 = alStack_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_230,"foo","");
  IKey((string *)auStack_2b0,plStack_230,psStack_228,100,kTypeValue);
  plStack_250 = alStack_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_250,"bar","");
  IKey(&sStack_290,plStack_250,psStack_248,99,kTypeValue);
  Shorten(&sStack_1f0,(leveldb *)auStack_2b0._0_8_,(string *)auStack_2b0._8_8_,&sStack_290);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&TStack_1d0,&sStack_270,&sStack_1f0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_1f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_290._M_dataplus._M_p != &sStack_290.field_2) {
    operator_delete(sStack_290._M_dataplus._M_p);
  }
  if (plStack_250 != alStack_240) {
    operator_delete(plStack_250);
  }
  if ((leveldb *)auStack_2b0._0_8_ != (leveldb *)(auStack_2b0 + 0x10)) {
    operator_delete((void *)auStack_2b0._0_8_);
  }
  if (plStack_230 != alStack_220) {
    operator_delete(plStack_230);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_270._M_dataplus._M_p != &sStack_270.field_2) {
    operator_delete(sStack_270._M_dataplus._M_p);
  }
  if (plStack_210 != alStack_200) {
    operator_delete(plStack_210);
  }
  test::Tester::~Tester(&TStack_1d0);
  TStack_1d0.ok_ = true;
  TStack_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat_test.cc"
  ;
  TStack_1d0.line_ = 0x5f;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1d0.ss_);
  plStack_210 = alStack_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_210,"g","");
  IKey(&sStack_270,plStack_210,psStack_208,0xffffffffffffff,kTypeValue);
  plStack_230 = alStack_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_230,"foo","");
  IKey((string *)auStack_2b0,plStack_230,psStack_228,100,kTypeValue);
  plStack_250 = alStack_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_250,"hello","");
  IKey(&sStack_290,plStack_250,psStack_248,200,kTypeValue);
  Shorten(&sStack_1f0,(leveldb *)auStack_2b0._0_8_,(string *)auStack_2b0._8_8_,&sStack_290);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&TStack_1d0,&sStack_270,&sStack_1f0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_1f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_290._M_dataplus._M_p != &sStack_290.field_2) {
    operator_delete(sStack_290._M_dataplus._M_p);
  }
  if (plStack_250 != alStack_240) {
    operator_delete(plStack_250);
  }
  if ((leveldb *)auStack_2b0._0_8_ != (leveldb *)(auStack_2b0 + 0x10)) {
    operator_delete((void *)auStack_2b0._0_8_);
  }
  if (plStack_230 != alStack_220) {
    operator_delete(plStack_230);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_270._M_dataplus._M_p != &sStack_270.field_2) {
    operator_delete(sStack_270._M_dataplus._M_p);
  }
  if (plStack_210 != alStack_200) {
    operator_delete(plStack_210);
  }
  test::Tester::~Tester(&TStack_1d0);
  TStack_1d0.ok_ = true;
  TStack_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat_test.cc"
  ;
  TStack_1d0.line_ = 100;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1d0.ss_);
  plStack_210 = alStack_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_210,"foo","");
  IKey(&sStack_270,plStack_210,psStack_208,100,kTypeValue);
  plStack_230 = alStack_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_230,"foo","");
  IKey((string *)auStack_2b0,plStack_230,psStack_228,100,kTypeValue);
  plStack_250 = alStack_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_250,"foobar","");
  IKey(&sStack_290,plStack_250,psStack_248,200,kTypeValue);
  Shorten(&sStack_1f0,(leveldb *)auStack_2b0._0_8_,(string *)auStack_2b0._8_8_,&sStack_290);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&TStack_1d0,&sStack_270,&sStack_1f0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_1f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_290._M_dataplus._M_p != &sStack_290.field_2) {
    operator_delete(sStack_290._M_dataplus._M_p);
  }
  if (plStack_250 != alStack_240) {
    operator_delete(plStack_250);
  }
  if ((leveldb *)auStack_2b0._0_8_ != (leveldb *)(auStack_2b0 + 0x10)) {
    operator_delete((void *)auStack_2b0._0_8_);
  }
  if (plStack_230 != alStack_220) {
    operator_delete(plStack_230);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_270._M_dataplus._M_p != &sStack_270.field_2) {
    operator_delete(sStack_270._M_dataplus._M_p);
  }
  if (plStack_210 != alStack_200) {
    operator_delete(plStack_210);
  }
  test::Tester::~Tester(&TStack_1d0);
  TStack_1d0.ok_ = true;
  TStack_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat_test.cc"
  ;
  TStack_1d0.line_ = 0x69;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1d0.ss_);
  plStack_210 = alStack_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_210,"foobar","");
  IKey(&sStack_270,plStack_210,psStack_208,100,kTypeValue);
  plStack_230 = alStack_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_230,"foobar","");
  IKey((string *)auStack_2b0,plStack_230,psStack_228,100,kTypeValue);
  plStack_250 = alStack_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_250,"foo","");
  IKey(&sStack_290,plStack_250,psStack_248,200,kTypeValue);
  Shorten(&sStack_1f0,(leveldb *)auStack_2b0._0_8_,(string *)auStack_2b0._8_8_,&sStack_290);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&TStack_1d0,&sStack_270,&sStack_1f0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_1f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_290._M_dataplus._M_p != &sStack_290.field_2) {
    operator_delete(sStack_290._M_dataplus._M_p);
  }
  if (plStack_250 != alStack_240) {
    operator_delete(plStack_250);
  }
  if ((leveldb *)auStack_2b0._0_8_ != (leveldb *)(auStack_2b0 + 0x10)) {
    operator_delete((void *)auStack_2b0._0_8_);
  }
  if (plStack_230 != alStack_220) {
    operator_delete(plStack_230);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_270._M_dataplus._M_p != &sStack_270.field_2) {
    operator_delete(sStack_270._M_dataplus._M_p);
  }
  if (plStack_210 != alStack_200) {
    operator_delete(plStack_210);
  }
  test::Tester::~Tester(&TStack_1d0);
  return;
}

Assistant:

TEST(FormatTest, InternalKeyShortSeparator) {
  // When user keys are same
  ASSERT_EQ(IKey("foo", 100, kTypeValue),
            Shorten(IKey("foo", 100, kTypeValue), IKey("foo", 99, kTypeValue)));
  ASSERT_EQ(
      IKey("foo", 100, kTypeValue),
      Shorten(IKey("foo", 100, kTypeValue), IKey("foo", 101, kTypeValue)));
  ASSERT_EQ(
      IKey("foo", 100, kTypeValue),
      Shorten(IKey("foo", 100, kTypeValue), IKey("foo", 100, kTypeValue)));
  ASSERT_EQ(
      IKey("foo", 100, kTypeValue),
      Shorten(IKey("foo", 100, kTypeValue), IKey("foo", 100, kTypeDeletion)));

  // When user keys are misordered
  ASSERT_EQ(IKey("foo", 100, kTypeValue),
            Shorten(IKey("foo", 100, kTypeValue), IKey("bar", 99, kTypeValue)));

  // When user keys are different, but correctly ordered
  ASSERT_EQ(
      IKey("g", kMaxSequenceNumber, kValueTypeForSeek),
      Shorten(IKey("foo", 100, kTypeValue), IKey("hello", 200, kTypeValue)));

  // When start user key is prefix of limit user key
  ASSERT_EQ(
      IKey("foo", 100, kTypeValue),
      Shorten(IKey("foo", 100, kTypeValue), IKey("foobar", 200, kTypeValue)));

  // When limit user key is prefix of start user key
  ASSERT_EQ(
      IKey("foobar", 100, kTypeValue),
      Shorten(IKey("foobar", 100, kTypeValue), IKey("foo", 200, kTypeValue)));
}